

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# build_log.cc
# Opt level: O0

bool __thiscall
BuildLog::Restat(BuildLog *this,StringPiece path,DiskInterface *disk_interface,int output_count,
                char **outputs,string *err)

{
  Metrics *this_00;
  DiskInterface *pDVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  Metric *pMVar5;
  char *pcVar6;
  FILE *__stream;
  int *piVar7;
  pointer ppVar8;
  long lVar9;
  Metric *local_120;
  TimeStamp mtime;
  int j;
  bool skip;
  _Node_iterator_base<std::pair<const_StringPiece,_BuildLog::LogEntry_*>,_true> local_e0;
  iterator i;
  FILE *f;
  undefined1 local_a8 [8];
  string temp_path;
  ScopedMetric metrics_h_scoped;
  allocator<char> local_61;
  string local_60;
  char **local_40;
  char **outputs_local;
  DiskInterface *pDStack_30;
  int output_count_local;
  DiskInterface *disk_interface_local;
  BuildLog *this_local;
  StringPiece path_local;
  
  path_local.str_ = (char *)path.len_;
  this_local = (BuildLog *)path.str_;
  local_40 = outputs;
  outputs_local._4_4_ = output_count;
  pDStack_30 = disk_interface;
  disk_interface_local = (DiskInterface *)this;
  if ((Restat(StringPiece,DiskInterface_const&,int,char**,std::__cxx11::string*)::metrics_h_metric
       == '\0') &&
     (iVar4 = __cxa_guard_acquire(&Restat(StringPiece,DiskInterface_const&,int,char**,std::__cxx11::string*)
                                   ::metrics_h_metric), this_00 = g_metrics, iVar4 != 0)) {
    if (g_metrics == (Metrics *)0x0) {
      local_120 = (Metric *)0x0;
      Restat::metrics_h_metric = local_120;
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_60,".ninja_log restat",&local_61);
      pMVar5 = Metrics::NewMetric(this_00,&local_60);
      std::__cxx11::string::~string((string *)&local_60);
      std::allocator<char>::~allocator(&local_61);
      Restat::metrics_h_metric = pMVar5;
    }
    __cxa_guard_release(&Restat(StringPiece,DiskInterface_const&,int,char**,std::__cxx11::string*)::
                         metrics_h_metric);
  }
  ScopedMetric::ScopedMetric
            ((ScopedMetric *)((long)&temp_path.field_2 + 8),Restat::metrics_h_metric);
  Close(this);
  StringPiece::AsString_abi_cxx11_((string *)&f,(StringPiece *)&this_local);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&f,".restat");
  std::__cxx11::string::~string((string *)&f);
  pcVar6 = (char *)std::__cxx11::string::c_str();
  __stream = fopen(pcVar6,"wb");
  if (__stream == (FILE *)0x0) {
    piVar7 = __errno_location();
    pcVar6 = strerror(*piVar7);
    std::__cxx11::string::operator=((string *)err,pcVar6);
    path_local.len_._7_1_ = 0;
  }
  else {
    iVar4 = fprintf(__stream,"# ninja log v%d\n",5);
    if (iVar4 < 0) {
      piVar7 = __errno_location();
      pcVar6 = strerror(*piVar7);
      std::__cxx11::string::operator=((string *)err,pcVar6);
      fclose(__stream);
      path_local.len_._7_1_ = 0;
    }
    else {
      local_e0._M_cur =
           (__node_type *)
           std::
           unordered_map<StringPiece,_BuildLog::LogEntry_*,_std::hash<StringPiece>,_std::equal_to<StringPiece>,_std::allocator<std::pair<const_StringPiece,_BuildLog::LogEntry_*>_>_>
           ::begin(&this->entries_);
      while( true ) {
        _j = (__node_type *)
             std::
             unordered_map<StringPiece,_BuildLog::LogEntry_*,_std::hash<StringPiece>,_std::equal_to<StringPiece>,_std::allocator<std::pair<const_StringPiece,_BuildLog::LogEntry_*>_>_>
             ::end(&this->entries_);
        bVar2 = std::__detail::operator!=
                          (&local_e0,
                           (_Node_iterator_base<std::pair<const_StringPiece,_BuildLog::LogEntry_*>,_true>
                            *)&j);
        if (!bVar2) break;
        bVar2 = 0 < outputs_local._4_4_;
        for (mtime._0_4_ = 0; (int)mtime < outputs_local._4_4_; mtime._0_4_ = (int)mtime + 1) {
          ppVar8 = std::__detail::
                   _Node_iterator<std::pair<const_StringPiece,_BuildLog::LogEntry_*>,_false,_true>::
                   operator->((_Node_iterator<std::pair<const_StringPiece,_BuildLog::LogEntry_*>,_false,_true>
                               *)&local_e0);
          bVar3 = std::operator==(&ppVar8->second->output,local_40[(int)mtime]);
          if (bVar3) {
            bVar2 = false;
            break;
          }
        }
        pDVar1 = pDStack_30;
        if (!bVar2) {
          ppVar8 = std::__detail::
                   _Node_iterator<std::pair<const_StringPiece,_BuildLog::LogEntry_*>,_false,_true>::
                   operator->((_Node_iterator<std::pair<const_StringPiece,_BuildLog::LogEntry_*>,_false,_true>
                               *)&local_e0);
          lVar9 = (**(code **)(*(long *)pDVar1 + 0x18))(pDVar1,ppVar8->second,err);
          if (lVar9 == -1) {
            fclose(__stream);
            path_local.len_._7_1_ = 0;
            goto LAB_001090f4;
          }
          ppVar8 = std::__detail::
                   _Node_iterator<std::pair<const_StringPiece,_BuildLog::LogEntry_*>,_false,_true>::
                   operator->((_Node_iterator<std::pair<const_StringPiece,_BuildLog::LogEntry_*>,_false,_true>
                               *)&local_e0);
          ppVar8->second->mtime = lVar9;
        }
        ppVar8 = std::__detail::
                 _Node_iterator<std::pair<const_StringPiece,_BuildLog::LogEntry_*>,_false,_true>::
                 operator->((_Node_iterator<std::pair<const_StringPiece,_BuildLog::LogEntry_*>,_false,_true>
                             *)&local_e0);
        bVar2 = WriteEntry(this,(FILE *)__stream,ppVar8->second);
        if (!bVar2) {
          piVar7 = __errno_location();
          pcVar6 = strerror(*piVar7);
          std::__cxx11::string::operator=((string *)err,pcVar6);
          fclose(__stream);
          path_local.len_._7_1_ = 0;
          goto LAB_001090f4;
        }
        std::__detail::
        _Node_iterator<std::pair<const_StringPiece,_BuildLog::LogEntry_*>,_false,_true>::operator++
                  ((_Node_iterator<std::pair<const_StringPiece,_BuildLog::LogEntry_*>,_false,_true>
                    *)&local_e0);
      }
      fclose(__stream);
      iVar4 = unlink((char *)this_local);
      if (iVar4 < 0) {
        piVar7 = __errno_location();
        pcVar6 = strerror(*piVar7);
        std::__cxx11::string::operator=((string *)err,pcVar6);
        path_local.len_._7_1_ = 0;
      }
      else {
        pcVar6 = (char *)std::__cxx11::string::c_str();
        iVar4 = rename(pcVar6,(char *)this_local);
        if (iVar4 < 0) {
          piVar7 = __errno_location();
          pcVar6 = strerror(*piVar7);
          std::__cxx11::string::operator=((string *)err,pcVar6);
          path_local.len_._7_1_ = 0;
        }
        else {
          path_local.len_._7_1_ = 1;
        }
      }
    }
  }
LAB_001090f4:
  i.super__Node_iterator_base<std::pair<const_StringPiece,_BuildLog::LogEntry_*>,_true>._M_cur._4_4_
       = 1;
  std::__cxx11::string::~string((string *)local_a8);
  ScopedMetric::~ScopedMetric((ScopedMetric *)((long)&temp_path.field_2 + 8));
  return (bool)(path_local.len_._7_1_ & 1);
}

Assistant:

bool BuildLog::Restat(const StringPiece path,
                      const DiskInterface& disk_interface,
                      const int output_count, char** outputs,
                      std::string* const err) {
  METRIC_RECORD(".ninja_log restat");

  Close();
  std::string temp_path = path.AsString() + ".restat";
  FILE* f = fopen(temp_path.c_str(), "wb");
  if (!f) {
    *err = strerror(errno);
    return false;
  }

  if (fprintf(f, kFileSignature, kCurrentVersion) < 0) {
    *err = strerror(errno);
    fclose(f);
    return false;
  }
  for (Entries::iterator i = entries_.begin(); i != entries_.end(); ++i) {
    bool skip = output_count > 0;
    for (int j = 0; j < output_count; ++j) {
      if (i->second->output == outputs[j]) {
        skip = false;
        break;
      }
    }
    if (!skip) {
      const TimeStamp mtime = disk_interface.Stat(i->second->output, err);
      if (mtime == -1) {
        fclose(f);
        return false;
      }
      i->second->mtime = mtime;
    }

    if (!WriteEntry(f, *i->second)) {
      *err = strerror(errno);
      fclose(f);
      return false;
    }
  }

  fclose(f);
  if (unlink(path.str_) < 0) {
    *err = strerror(errno);
    return false;
  }

  if (rename(temp_path.c_str(), path.str_) < 0) {
    *err = strerror(errno);
    return false;
  }

  return true;
}